

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.cpp
# Opt level: O0

bool anon_unknown.dwarf_2c124::unserialize_fundamental<int>
               (int *obj,char *bufferData,size_t bufferSize,size_t *offset,Unserialize *op)

{
  bool bVar1;
  size_t *in_RCX;
  ulong in_RDX;
  long in_RSI;
  void *in_RDI;
  Unserialize *in_R8;
  unsigned_long osize;
  
  bVar1 = *in_RCX + 4 <= in_RDX;
  if (bVar1) {
    memcpy(in_RDI,(void *)(in_RSI + *in_RCX),4);
    advance<GGSock::Unserialize>(in_RCX,4,in_R8);
  }
  return bVar1;
}

Assistant:

inline bool unserialize_fundamental(T & obj, const char * bufferData, size_t bufferSize, size_t & offset, GGSock::Unserialize & op) noexcept {
            static_assert(std::is_fundamental<T>::value, "Fundamental type required");

            auto osize = sizeof(obj);

            if (offset + osize > bufferSize) return false;

            std::memcpy(reinterpret_cast<char *>(&obj), bufferData + offset, osize);
            ::advance(offset, osize, op);

            return true;
        }